

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text_format.cc
# Opt level: O0

bool __thiscall
google::protobuf::TextFormat::Parser::ParserImpl::ConsumeDouble(ParserImpl *this,double *value)

{
  bool bVar1;
  Token *pTVar2;
  double dVar3;
  undefined1 auVar4 [16];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  int local_ac;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a8;
  undefined1 local_88 [8];
  string text;
  uint64 integer_value;
  allocator local_49;
  string local_48;
  byte local_21;
  double *pdStack_20;
  bool negative;
  double *value_local;
  ParserImpl *this_local;
  
  local_21 = 0;
  pdStack_20 = value;
  value_local = (double *)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_48,"-",&local_49);
  bVar1 = TryConsume(this,&local_48);
  std::__cxx11::string::~string((string *)&local_48);
  std::allocator<char>::~allocator((allocator<char> *)&local_49);
  if (bVar1) {
    local_21 = 1;
  }
  bVar1 = LookingAtType(this,TYPE_INTEGER);
  if (bVar1) {
    bVar1 = ConsumeUnsignedDecimalInteger
                      (this,(uint64 *)(text.field_2._M_local_buf + 8),0xffffffffffffffff);
    if (!bVar1) {
      this_local._7_1_ = 0;
      goto LAB_00b4a491;
    }
    auVar4._8_4_ = (int)((ulong)text.field_2._8_8_ >> 0x20);
    auVar4._0_8_ = text.field_2._8_8_;
    auVar4._12_4_ = 0x45300000;
    *pdStack_20 = (auVar4._8_8_ - 1.9342813113834067e+25) +
                  ((double)CONCAT44(0x43300000,(int)text.field_2._8_8_) - 4503599627370496.0);
  }
  else {
    bVar1 = LookingAtType(this,TYPE_FLOAT);
    if (bVar1) {
      pTVar2 = io::Tokenizer::current(&this->tokenizer_);
      dVar3 = io::Tokenizer::ParseFloat(&pTVar2->text);
      *pdStack_20 = dVar3;
      io::Tokenizer::Next(&this->tokenizer_);
    }
    else {
      bVar1 = LookingAtType(this,TYPE_IDENTIFIER);
      if (!bVar1) {
        pTVar2 = io::Tokenizer::current(&this->tokenizer_);
        std::operator+(&local_d0,"Expected double, got: ",&pTVar2->text);
        ReportError(this,&local_d0);
        std::__cxx11::string::~string((string *)&local_d0);
        this_local._7_1_ = 0;
        goto LAB_00b4a491;
      }
      pTVar2 = io::Tokenizer::current(&this->tokenizer_);
      std::__cxx11::string::string((string *)local_88,(string *)&pTVar2->text);
      LowerString((string *)local_88);
      bVar1 = std::operator==((string *)local_88,"inf");
      if ((bVar1) ||
         (bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)local_88,"infinity"), bVar1)) {
        dVar3 = std::numeric_limits<double>::infinity();
        *pdStack_20 = dVar3;
        io::Tokenizer::Next(&this->tokenizer_);
LAB_00b4a3b3:
        local_ac = 0;
      }
      else {
        bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )local_88,"nan");
        if (bVar1) {
          dVar3 = std::numeric_limits<double>::quiet_NaN();
          *pdStack_20 = dVar3;
          io::Tokenizer::Next(&this->tokenizer_);
          goto LAB_00b4a3b3;
        }
        std::operator+(&local_a8,"Expected double, got: ",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_88
                      );
        ReportError(this,&local_a8);
        std::__cxx11::string::~string((string *)&local_a8);
        this_local._7_1_ = 0;
        local_ac = 1;
      }
      std::__cxx11::string::~string((string *)local_88);
      if (local_ac != 0) goto LAB_00b4a491;
    }
  }
  if ((local_21 & 1) != 0) {
    *pdStack_20 = -*pdStack_20;
  }
  this_local._7_1_ = 1;
LAB_00b4a491:
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool ConsumeDouble(double* value) {
    bool negative = false;

    if (TryConsume("-")) {
      negative = true;
    }

    // A double can actually be an integer, according to the tokenizer.
    // Therefore, we must check both cases here.
    if (LookingAtType(io::Tokenizer::TYPE_INTEGER)) {
      // We have found an integer value for the double.
      uint64 integer_value;
      DO(ConsumeUnsignedDecimalInteger(&integer_value, kuint64max));

      *value = static_cast<double>(integer_value);
    } else if (LookingAtType(io::Tokenizer::TYPE_FLOAT)) {
      // We have found a float value for the double.
      *value = io::Tokenizer::ParseFloat(tokenizer_.current().text);

      // Mark the current token as consumed.
      tokenizer_.Next();
    } else if (LookingAtType(io::Tokenizer::TYPE_IDENTIFIER)) {
      string text = tokenizer_.current().text;
      LowerString(&text);
      if (text == "inf" ||
          text == "infinity") {
        *value = std::numeric_limits<double>::infinity();
        tokenizer_.Next();
      } else if (text == "nan") {
        *value = std::numeric_limits<double>::quiet_NaN();
        tokenizer_.Next();
      } else {
        ReportError("Expected double, got: " + text);
        return false;
      }
    } else {
      ReportError("Expected double, got: " + tokenizer_.current().text);
      return false;
    }

    if (negative) {
      *value = -*value;
    }

    return true;
  }